

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus_settings.cpp
# Opt level: O0

void __thiscall CMenus::RenderSettingsControls(CMenus *this,CUIRect MainView)

{
  CUIRect Rect;
  CUIRect Rect_00;
  CUIRect Rect_01;
  CUIRect Rect_02;
  CUIRect Rect_03;
  CUIRect Rect_04;
  CUIRect Rect_05;
  CUIRect Rect_06;
  vec4 ColorHot;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  IClient *pIVar5;
  CConfig *pCVar6;
  IInput *pIVar7;
  CButtonContainer *pBC;
  char *pCancelButtonLabel;
  char *pConfirmButtonLabel;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  CGameClient *in_XMM1_Qa;
  float ButtonWidth;
  float Spacing;
  float Split;
  float HeaderHeight;
  CUIRect LastExpandRect;
  CScrollRegionParams ScrollParams;
  vec2 ScrollOffset;
  CUIRect Background;
  CUIRect Button;
  CUIRect BottomView;
  CScrollRegion *in_stack_fffffffffffffcf8;
  bool *pbVar8;
  CScrollRegion *in_stack_fffffffffffffd00;
  CMenus *in_stack_fffffffffffffd08;
  char *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  float in_stack_fffffffffffffd1c;
  undefined1 TextFade;
  float in_stack_fffffffffffffd20;
  float in_stack_fffffffffffffd24;
  vec2 *in_stack_fffffffffffffd28;
  char *pfnConfirmButtonCallback;
  CUIRect *in_stack_fffffffffffffd30;
  CScrollRegion *in_stack_fffffffffffffd38;
  undefined1 Checked;
  char *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd50;
  float HeaderHeight_00;
  CScrollRegion *this_00;
  char *in_stack_fffffffffffffd58;
  CMenus *this_01;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 uVar10;
  void *in_stack_fffffffffffffd68;
  undefined8 *pID;
  CMenus *in_stack_fffffffffffffd70;
  CMenus *this_02;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  vector2_base<float> *this_03;
  undefined8 uVar11;
  code *pcVar12;
  bool *in_stack_fffffffffffffe10;
  bool *pActive;
  vector4_base<float> local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f4;
  undefined8 uStack_ec;
  vector4_base<float> local_e4;
  undefined4 local_c8;
  vector4_base<float> local_c4 [6];
  vector2_base<float> local_60;
  vector4_base<float> local_58;
  _func_int **local_48;
  CGameClient *local_40;
  undefined8 local_38;
  undefined8 local_28;
  undefined1 local_18 [8];
  CGameClient *local_10;
  long local_8;
  
  HeaderHeight_00 = (float)((ulong)in_stack_fffffffffffffd50 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (undefined1  [8])CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_10 = in_XMM1_Qa;
  CUIRect::HSplitBottom
            ((CUIRect *)in_stack_fffffffffffffd08,(float)((ulong)in_stack_fffffffffffffd00 >> 0x20),
             (CUIRect *)in_stack_fffffffffffffcf8,(CUIRect *)0x1a9246);
  pIVar5 = CComponent::Client((CComponent *)0x1a9253);
  iVar2 = IClient::State(pIVar5);
  if (iVar2 == 3) {
    local_48 = (_func_int **)local_18;
    local_40 = local_10;
  }
  else {
    CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd08,
                       (float)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                       (CUIRect *)in_stack_fffffffffffffcf8,(CUIRect *)0x1a92a3);
  }
  pCVar6 = CComponent::Config((CComponent *)0x1a92b0);
  vector4_base<float>::vector4_base(&local_58,0.0,0.0,0.0,(float)pCVar6->m_ClMenuAlpha / 100.0);
  pIVar5 = CComponent::Client((CComponent *)0x1a92e7);
  IClient::State(pIVar5);
  CUIRect::Draw((CUIRect *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                (vec4 *)in_stack_fffffffffffffd70,(float)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                (int)in_stack_fffffffffffffd68);
  CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd08,
                     (float)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                     (CUIRect *)in_stack_fffffffffffffcf8,(CUIRect *)0x1a933a);
  CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd08,
                     (float)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                     (CUIRect *)in_stack_fffffffffffffcf8,(CUIRect *)0x1a9356);
  if ((RenderSettingsControls(CUIRect)::s_ScrollRegion == '\0') &&
     (iVar2 = __cxa_guard_acquire(&RenderSettingsControls(CUIRect)::s_ScrollRegion), iVar2 != 0)) {
    CScrollRegion::CScrollRegion(in_stack_fffffffffffffcf8);
    __cxa_guard_release(&RenderSettingsControls(CUIRect)::s_ScrollRegion);
  }
  this_03 = &local_60;
  vector2_base<float>::vector2_base(this_03,0.0,0.0);
  iVar2 = (int)this_03;
  CScrollRegionParams::CScrollRegionParams((CScrollRegionParams *)in_stack_fffffffffffffd08);
  vector4_base<float>::vector4_base(&local_e4,0.0,0.0,0.0,0.0);
  local_c4[0].field_0 = local_e4.field_0;
  local_c4[0].field_1 = local_e4.field_1;
  local_c4[0].field_2 = local_e4.field_2;
  local_c4[0].field_3 = local_e4.field_3;
  local_c8 = 0x42700000;
  CScrollRegion::Begin
            (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             (CScrollRegionParams *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  local_18._4_4_ = (float)local_18._4_4_ + local_60.field_1.y;
  Localize(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
  pbVar8 = &RenderSettingsControls::s_MouseActive;
  DoIndependentDropdownMenu
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             (CUIRect *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             in_stack_fffffffffffffd58,HeaderHeight_00,(FDropdownCallback)in_stack_fffffffffffffd40,
             in_stack_fffffffffffffe10);
  CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd08,
                     (float)((ulong)in_stack_fffffffffffffd00 >> 0x20),(CUIRect *)pbVar8,
                     (CUIRect *)0x1a94fa);
  local_108 = local_f4;
  uStack_100 = uStack_ec;
  Rect.w = (float)in_stack_fffffffffffffd18;
  Rect._0_8_ = in_stack_fffffffffffffd10;
  Rect.h = in_stack_fffffffffffffd1c;
  CScrollRegion::AddRect(in_stack_fffffffffffffd00,Rect);
  if ((RenderSettingsControls(CUIRect)::s_JoystickActive == '\0') &&
     (iVar3 = __cxa_guard_acquire(&RenderSettingsControls(CUIRect)::s_JoystickActive), iVar3 != 0))
  {
    pIVar7 = CGameClient::Input(*(CGameClient **)(in_RDI + 8));
    iVar3 = (*(pIVar7->super_IInterface)._vptr_IInterface[6])();
    RenderSettingsControls::s_JoystickActive = 0 < iVar3;
    __cxa_guard_release(&RenderSettingsControls(CUIRect)::s_JoystickActive);
  }
  this_01 = (CMenus *)0x26892c;
  Localize(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
  pbVar8 = &RenderSettingsControls::s_JoystickActive;
  this_02 = (CMenus *)local_18;
  uVar9 = 0x41a00000;
  DoIndependentDropdownMenu
            (this_02,in_stack_fffffffffffffd68,
             (CUIRect *)CONCAT44(in_stack_fffffffffffffd64,0x41a00000),(char *)this_01,
             HeaderHeight_00,(FDropdownCallback)in_stack_fffffffffffffd40,in_stack_fffffffffffffe10)
  ;
  uVar10 = 0x41200000;
  pID = &local_f4;
  CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd08,
                     (float)((ulong)in_stack_fffffffffffffd00 >> 0x20),(CUIRect *)pbVar8,
                     (CUIRect *)0x1a9651);
  local_118 = local_f4;
  uStack_110 = uStack_ec;
  this_00 = &RenderSettingsControls::s_ScrollRegion;
  Rect_00.w = (float)in_stack_fffffffffffffd18;
  Rect_00._0_8_ = in_stack_fffffffffffffd10;
  Rect_00.h = in_stack_fffffffffffffd1c;
  CScrollRegion::AddRect(in_stack_fffffffffffffd00,Rect_00);
  Localize(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
  pActive = (bool *)0x0;
  pbVar8 = &RenderSettingsControls::s_MovementActive;
  DoIndependentDropdownMenu
            (this_02,pID,(CUIRect *)CONCAT44(uVar10,uVar9),(char *)this_01,
             (float)((ulong)this_00 >> 0x20),(FDropdownCallback)in_stack_fffffffffffffd40,
             (bool *)0x0);
  CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd08,
                     (float)((ulong)in_stack_fffffffffffffd00 >> 0x20),(CUIRect *)pbVar8,
                     (CUIRect *)0x1a9716);
  local_128 = local_f4;
  uStack_120 = uStack_ec;
  Rect_01.w = (float)in_stack_fffffffffffffd18;
  Rect_01._0_8_ = in_stack_fffffffffffffd10;
  Rect_01.h = in_stack_fffffffffffffd1c;
  CScrollRegion::AddRect(in_stack_fffffffffffffd00,Rect_01);
  Localize(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
  pbVar8 = &RenderSettingsControls::s_WeaponActive;
  DoIndependentDropdownMenu
            (this_02,pID,(CUIRect *)CONCAT44(uVar10,uVar9),(char *)this_01,
             (float)((ulong)this_00 >> 0x20),(FDropdownCallback)in_stack_fffffffffffffd40,pActive);
  CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd08,
                     (float)((ulong)in_stack_fffffffffffffd00 >> 0x20),(CUIRect *)pbVar8,
                     (CUIRect *)0x1a97d4);
  local_138 = local_f4;
  uStack_130 = uStack_ec;
  Rect_02.w = (float)in_stack_fffffffffffffd18;
  Rect_02._0_8_ = in_stack_fffffffffffffd10;
  Rect_02.h = in_stack_fffffffffffffd1c;
  CScrollRegion::AddRect(in_stack_fffffffffffffd00,Rect_02);
  Localize(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
  pbVar8 = &RenderSettingsControls::s_VotingActive;
  DoIndependentDropdownMenu
            (this_02,pID,(CUIRect *)CONCAT44(uVar10,uVar9),(char *)this_01,
             (float)((ulong)this_00 >> 0x20),(FDropdownCallback)in_stack_fffffffffffffd40,pActive);
  CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd08,
                     (float)((ulong)in_stack_fffffffffffffd00 >> 0x20),(CUIRect *)pbVar8,
                     (CUIRect *)0x1a9892);
  local_148 = local_f4;
  uStack_140 = uStack_ec;
  Rect_03.w = (float)in_stack_fffffffffffffd18;
  Rect_03._0_8_ = in_stack_fffffffffffffd10;
  Rect_03.h = in_stack_fffffffffffffd1c;
  CScrollRegion::AddRect(in_stack_fffffffffffffd00,Rect_03);
  Localize(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
  iVar3 = 0;
  pbVar8 = &RenderSettingsControls::s_ChatActive;
  DoIndependentDropdownMenu
            (this_02,pID,(CUIRect *)CONCAT44(uVar10,uVar9),(char *)this_01,
             (float)((ulong)this_00 >> 0x20),(FDropdownCallback)in_stack_fffffffffffffd40,pActive);
  CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd08,
                     (float)((ulong)in_stack_fffffffffffffd00 >> 0x20),(CUIRect *)pbVar8,
                     (CUIRect *)0x1a9950);
  local_158 = local_f4;
  uStack_150 = uStack_ec;
  Rect_04.w = (float)in_stack_fffffffffffffd18;
  Rect_04._0_8_ = in_stack_fffffffffffffd10;
  Rect_04.h = in_stack_fffffffffffffd1c;
  CScrollRegion::AddRect(in_stack_fffffffffffffd00,Rect_04);
  Localize(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
  pcVar12 = RenderSettingsControlsScoreboard;
  pbVar8 = &RenderSettingsControls::s_ScoreboardActive;
  DoIndependentDropdownMenu
            (this_02,pID,(CUIRect *)CONCAT44(uVar10,uVar9),(char *)this_01,
             (float)((ulong)this_00 >> 0x20),(FDropdownCallback)in_stack_fffffffffffffd40,pActive);
  CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd08,
                     (float)((ulong)in_stack_fffffffffffffd00 >> 0x20),(CUIRect *)pbVar8,
                     (CUIRect *)0x1a9a0e);
  local_168 = local_f4;
  uStack_160 = uStack_ec;
  Rect_05.w = (float)in_stack_fffffffffffffd18;
  Rect_05._0_8_ = in_stack_fffffffffffffd10;
  Rect_05.h = in_stack_fffffffffffffd1c;
  CScrollRegion::AddRect(in_stack_fffffffffffffd00,Rect_05);
  Localize(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
  uVar11 = 0;
  pbVar8 = &RenderSettingsControls::s_MiscActive;
  DoIndependentDropdownMenu
            (this_02,pID,(CUIRect *)CONCAT44(uVar10,uVar9),(char *)this_01,
             (float)((ulong)this_00 >> 0x20),(FDropdownCallback)in_stack_fffffffffffffd40,pActive);
  CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd08,
                     (float)((ulong)in_stack_fffffffffffffd00 >> 0x20),(CUIRect *)pbVar8,
                     (CUIRect *)0x1a9acc);
  local_178 = local_f4;
  uStack_170 = uStack_ec;
  Rect_06.w = (float)in_stack_fffffffffffffd18;
  Rect_06._0_8_ = in_stack_fffffffffffffd10;
  Rect_06.h = in_stack_fffffffffffffd1c;
  CScrollRegion::AddRect(in_stack_fffffffffffffd00,Rect_06);
  TextFade = (undefined1)((uint)in_stack_fffffffffffffd1c >> 0x18);
  CScrollRegion::End(in_stack_fffffffffffffd38);
  Checked = (undefined1)((ulong)in_stack_fffffffffffffd38 >> 0x38);
  CUIRect::VSplitRight
            ((CUIRect *)in_stack_fffffffffffffd08,(float)((ulong)in_stack_fffffffffffffd00 >> 0x20),
             (CUIRect *)pbVar8,(CUIRect *)0x1a9b83);
  RenderBackgroundShadow
            (in_stack_fffffffffffffd08,(CUIRect *)in_stack_fffffffffffffd00,
             SUB81((ulong)pbVar8 >> 0x38,0),SUB84(pbVar8,0));
  CUIRect::HSplitTop((CUIRect *)in_stack_fffffffffffffd08,
                     (float)((ulong)in_stack_fffffffffffffd00 >> 0x20),(CUIRect *)pbVar8,
                     (CUIRect *)0x1a9bc1);
  local_38 = local_28;
  if ((RenderSettingsControls(CUIRect)::s_ResetButton == '\0') &&
     (iVar4 = __cxa_guard_acquire(&RenderSettingsControls(CUIRect)::s_ResetButton), iVar4 != 0)) {
    CButtonContainer::CButtonContainer(&RenderSettingsControls::s_ResetButton,false);
    __cxa_guard_release(&RenderSettingsControls(CUIRect)::s_ResetButton);
  }
  pBC = (CButtonContainer *)Localize(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
  vector4_base<float>::vector4_base(&local_188,1.0,1.0,1.0,0.75);
  ColorHot._8_8_ = pcVar12;
  ColorHot.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)(int)uVar11;
  ColorHot.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)(int)((ulong)uVar11 >> 0x20)
  ;
  bVar1 = DoButton_Menu((CMenus *)this_00,pBC,in_stack_fffffffffffffd40,(bool)Checked,
                        in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,iVar3,
                        in_stack_fffffffffffffd24,in_stack_fffffffffffffd20,ColorHot,(bool)TextFade)
  ;
  if (bVar1) {
    pfnConfirmButtonCallback = "";
    Localize(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    pCancelButtonLabel = Localize(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    pConfirmButtonLabel = Localize(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    Localize(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    PopupConfirm(this_01,(char *)this_00,&pBC->m_CleanBackground,pConfirmButtonLabel,
                 pCancelButtonLabel,(FPopupButtonCallback)pfnConfirmButtonCallback,
                 (int)in_stack_fffffffffffffd24,0,iVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CMenus::RenderSettingsControls(CUIRect MainView)
{
	// cut view
	CUIRect BottomView, Button, Background;
	MainView.HSplitBottom(80.0f, &MainView, &BottomView);
	if(this->Client()->State() == IClient::STATE_ONLINE)
		Background = MainView;
	else
		MainView.HSplitTop(20.0f, 0, &Background);
	Background.Draw(vec4(0.0f, 0.0f, 0.0f, Config()->m_ClMenuAlpha/100.0f), 5.0f, Client()->State() == IClient::STATE_OFFLINE ? CUIRect::CORNER_ALL : CUIRect::CORNER_B);
	MainView.HSplitTop(20.0f, 0, &MainView);
	BottomView.HSplitTop(20.f, 0, &BottomView);

	const float HeaderHeight = 20.0f;

	static CScrollRegion s_ScrollRegion;
	vec2 ScrollOffset(0, 0);
	CScrollRegionParams ScrollParams;
	ScrollParams.m_ClipBgColor = vec4(0,0,0,0);
	ScrollParams.m_ScrollUnit = 60.0f; // inconsistent margin, 3 category header per scroll
	s_ScrollRegion.Begin(&MainView, &ScrollOffset, &ScrollParams);
	MainView.y += ScrollOffset.y;

	CUIRect LastExpandRect;
	static bool s_MouseActive = true;
	float Split = DoIndependentDropdownMenu(&s_MouseActive, &MainView, Localize("Mouse"), HeaderHeight, &CMenus::RenderSettingsControlsMouse, &s_MouseActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);
	static bool s_JoystickActive = m_pClient->Input()->NumJoysticks() > 0; // hide by default if no joystick found
	Split = DoIndependentDropdownMenu(&s_JoystickActive, &MainView, Localize("Joystick"), HeaderHeight, &CMenus::RenderSettingsControlsJoystick, &s_JoystickActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);
	static bool s_MovementActive = true;
	Split = DoIndependentDropdownMenu(&s_MovementActive, &MainView, Localize("Movement"), HeaderHeight, &CMenus::RenderSettingsControlsMovement, &s_MovementActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);
	static bool s_WeaponActive = true;
	Split = DoIndependentDropdownMenu(&s_WeaponActive, &MainView, Localize("Weapon"), HeaderHeight, &CMenus::RenderSettingsControlsWeapon, &s_WeaponActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);
	static bool s_VotingActive = true;
	Split = DoIndependentDropdownMenu(&s_VotingActive, &MainView, Localize("Voting"), HeaderHeight, &CMenus::RenderSettingsControlsVoting, &s_VotingActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);
	static bool s_ChatActive = true;
	Split = DoIndependentDropdownMenu(&s_ChatActive, &MainView, Localize("Chat"), HeaderHeight, &CMenus::RenderSettingsControlsChat, &s_ChatActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);
	static bool s_ScoreboardActive = true;
	Split = DoIndependentDropdownMenu(&s_ScoreboardActive, &MainView, Localize("Scoreboard"), HeaderHeight, &CMenus::RenderSettingsControlsScoreboard, &s_ScoreboardActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);
	static bool s_MiscActive = true;
	Split = DoIndependentDropdownMenu(&s_MiscActive, &MainView, Localize("Misc"), HeaderHeight, &CMenus::RenderSettingsControlsMisc, &s_MiscActive);

	MainView.HSplitTop(Split+10.0f, &LastExpandRect, &MainView);
	s_ScrollRegion.AddRect(LastExpandRect);

	s_ScrollRegion.End();

	// reset button
	float Spacing = 3.0f;
	float ButtonWidth = (BottomView.w/6.0f)-(Spacing*5.0)/6.0f;

	BottomView.VSplitRight(ButtonWidth, 0, &BottomView);
	RenderBackgroundShadow(&BottomView, true);

	BottomView.HSplitTop(25.0f, &BottomView, 0);
	Button = BottomView;
	static CButtonContainer s_ResetButton;
	if(DoButton_Menu(&s_ResetButton, Localize("Reset"), 0, &Button))
	{
		PopupConfirm(Localize("Reset controls"), Localize("Are you sure that you want to reset the controls to their defaults?"),
			Localize("Reset"), Localize("Cancel"), &CMenus::ResetSettingsControls);
	}
}